

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseRelationship(AsciiParser *this,Relationship *result)

{
  undefined8 uVar1;
  bool bVar2;
  ostream *poVar3;
  size_type sVar4;
  reference pvVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string local_1220;
  string local_1200;
  string local_11e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11c0 [32];
  ostringstream local_11a0 [8];
  ostringstream ss_e_6;
  string local_1028;
  ostringstream local_1008 [8];
  ostringstream ss_e_5;
  string local_e90;
  ostringstream local_e70 [8];
  ostringstream ss_e_4;
  undefined1 local_cf8 [8];
  optional<tinyusdz::Path> value_1;
  string local_c00;
  allocator local_bd9;
  string local_bd8 [32];
  fmt local_bb8 [32];
  ostringstream local_b98 [8];
  ostringstream ss_e_3;
  undefined1 local_a20 [8];
  Path abs_path_1;
  string local_948;
  string local_928;
  undefined1 local_908 [8];
  Path base_prim_path_1;
  size_t i;
  ostringstream local_810 [8];
  ostringstream ss_e_2;
  undefined1 local_698 [8];
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> values;
  allocator local_659;
  string local_658 [32];
  string local_638;
  ostringstream local_618 [8];
  ostringstream ss_e_1;
  undefined1 local_4a0 [8];
  string err;
  Path abs_path;
  string local_3a8;
  string local_388;
  undefined1 local_368 [8];
  Path base_prim_path;
  string local_290;
  ostringstream local_270 [8];
  ostringstream ss_e;
  undefined1 local_f8 [8];
  Path value;
  char c;
  Relationship *result_local;
  AsciiParser *this_local;
  
  bVar2 = LookChar1(this,&value.field_0xcf);
  if (bVar2) {
    if (value._207_1_ == '<') {
      Path::Path((Path *)local_f8);
      bVar2 = ReadBasicType(this,(Path *)local_f8);
      if (bVar2) {
        GetCurrentPrimPath_abi_cxx11_(&local_388,this);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_3a8,"",(allocator *)&abs_path.field_0xcf);
        Path::Path((Path *)local_368,&local_388,&local_3a8);
        ::std::__cxx11::string::~string((string *)&local_3a8);
        ::std::allocator<char>::~allocator((allocator<char> *)&abs_path.field_0xcf);
        ::std::__cxx11::string::~string((string *)&local_388);
        Path::Path((Path *)((long)&err.field_2 + 8));
        ::std::__cxx11::string::string((string *)local_4a0);
        bVar2 = pathutil::ResolveRelativePath
                          ((Path *)local_368,(Path *)local_f8,(Path *)((long)&err.field_2 + 8),
                           (string *)local_4a0);
        if (bVar2) {
          Relationship::set(result,(Path *)((long)&err.field_2 + 8));
          base_prim_path._204_4_ = 0;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_618);
          poVar3 = ::std::operator<<((ostream *)local_618,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ParseRelationship");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xdb6);
          ::std::operator<<(poVar3," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_658,"Invalid relative Path: {}. error = {}",&local_659);
          fmt::format<tinyusdz::Path,std::__cxx11::string>
                    (&local_638,(fmt *)local_658,(string *)local_f8,(Path *)local_4a0,in_R8);
          poVar3 = ::std::operator<<((ostream *)local_618,(string *)&local_638);
          ::std::operator<<(poVar3,"\n");
          ::std::__cxx11::string::~string((string *)&local_638);
          ::std::__cxx11::string::~string(local_658);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_659);
          ::std::__cxx11::ostringstream::str();
          PushError(this,(string *)
                         &values.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
          ::std::__cxx11::string::~string
                    ((string *)
                     &values.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          this_local._7_1_ = 0;
          base_prim_path._204_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_618);
        }
        ::std::__cxx11::string::~string((string *)local_4a0);
        Path::~Path((Path *)((long)&err.field_2 + 8));
        Path::~Path((Path *)local_368);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_270);
        poVar3 = ::std::operator<<((ostream *)local_270,"[error]");
        poVar3 = ::std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar3 = ::std::operator<<(poVar3,":");
        poVar3 = ::std::operator<<(poVar3,"ParseRelationship");
        poVar3 = ::std::operator<<(poVar3,"():");
        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xdab);
        ::std::operator<<(poVar3," ");
        poVar3 = ::std::operator<<((ostream *)local_270,"Failed to parse Path.");
        ::std::operator<<(poVar3,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_290);
        ::std::__cxx11::string::~string((string *)&local_290);
        this_local._7_1_ = 0;
        base_prim_path._204_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_270);
      }
      Path::~Path((Path *)local_f8);
    }
    else if (value._207_1_ == '[') {
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_698);
      bVar2 = ParseBasicTypeArray<tinyusdz::Path>
                        (this,(vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_698);
      if (bVar2) {
        base_prim_path_1._valid = false;
        base_prim_path_1._201_7_ = 0;
        for (; uVar1 = base_prim_path_1._200_8_,
            sVar4 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_698)
            , (ulong)uVar1 < sVar4; base_prim_path_1._200_8_ = base_prim_path_1._200_8_ + 1) {
          GetCurrentPrimPath_abi_cxx11_(&local_928,this);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_948,"",(allocator *)&abs_path_1.field_0xcf);
          Path::Path((Path *)local_908,&local_928,&local_948);
          ::std::__cxx11::string::~string((string *)&local_948);
          ::std::allocator<char>::~allocator((allocator<char> *)&abs_path_1.field_0xcf);
          ::std::__cxx11::string::~string((string *)&local_928);
          Path::Path((Path *)local_a20);
          pvVar5 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[]
                             ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_698,
                              base_prim_path_1._200_8_);
          bVar2 = pathutil::ResolveRelativePath
                            ((Path *)local_908,pvVar5,(Path *)local_a20,(string *)0x0);
          if (bVar2) {
            pvVar5 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[]
                               ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_698
                                ,base_prim_path_1._200_8_);
            Path::operator=(pvVar5,(Path *)local_a20);
            base_prim_path._204_4_ = 0;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_b98);
            poVar3 = ::std::operator<<((ostream *)local_b98,"[error]");
            poVar3 = ::std::operator<<(poVar3,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                      );
            poVar3 = ::std::operator<<(poVar3,":");
            poVar3 = ::std::operator<<(poVar3,"ParseRelationship");
            poVar3 = ::std::operator<<(poVar3,"():");
            poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xdc9);
            ::std::operator<<(poVar3," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_bd8,"Invalid relative Path: {}.",&local_bd9);
            pvVar5 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[]
                               ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_698
                                ,base_prim_path_1._200_8_);
            Path::full_path_name_abi_cxx11_(&local_c00,pvVar5);
            fmt::format<std::__cxx11::string>
                      (local_bb8,(string *)local_bd8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_c00);
            poVar3 = ::std::operator<<((ostream *)local_b98,(string *)local_bb8);
            ::std::operator<<(poVar3,"\n");
            ::std::__cxx11::string::~string((string *)local_bb8);
            ::std::__cxx11::string::~string((string *)&local_c00);
            ::std::__cxx11::string::~string(local_bd8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_bd9);
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)((long)&value_1.contained + 200));
            ::std::__cxx11::string::~string((string *)((long)&value_1.contained + 200));
            this_local._7_1_ = 0;
            base_prim_path._204_4_ = 1;
            ::std::__cxx11::ostringstream::~ostringstream(local_b98);
          }
          Path::~Path((Path *)local_a20);
          Path::~Path((Path *)local_908);
          if (base_prim_path._204_4_ != 0) goto LAB_005623fe;
        }
        Relationship::set(result,(vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                                 local_698);
        base_prim_path._204_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_810);
        poVar3 = ::std::operator<<((ostream *)local_810,"[error]");
        poVar3 = ::std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar3 = ::std::operator<<(poVar3,":");
        poVar3 = ::std::operator<<(poVar3,"ParseRelationship");
        poVar3 = ::std::operator<<(poVar3,"():");
        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xdbe);
        ::std::operator<<(poVar3," ");
        poVar3 = ::std::operator<<((ostream *)local_810,"Failed to parse PathVector.");
        ::std::operator<<(poVar3,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&i);
        ::std::__cxx11::string::~string((string *)&i);
        this_local._7_1_ = 0;
        base_prim_path._204_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_810);
      }
LAB_005623fe:
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_698);
    }
    else {
      if (value._207_1_ != 'N') {
        ::std::__cxx11::ostringstream::ostringstream(local_11a0);
        poVar3 = ::std::operator<<((ostream *)local_11a0,"[error]");
        poVar3 = ::std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar3 = ::std::operator<<(poVar3,":");
        poVar3 = ::std::operator<<(poVar3,"ParseRelationship");
        poVar3 = ::std::operator<<(poVar3,"():");
        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xde1);
        ::std::operator<<(poVar3," ");
        ::std::__cxx11::to_string(&local_1200,(int)(char)value._207_1_);
        ::std::operator+((char *)local_11e0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Unexpected char \"");
        ::std::operator+(local_11c0,(char *)local_11e0);
        poVar3 = ::std::operator<<((ostream *)local_11a0,(string *)local_11c0);
        ::std::operator<<(poVar3,"\n");
        ::std::__cxx11::string::~string((string *)local_11c0);
        ::std::__cxx11::string::~string(local_11e0);
        ::std::__cxx11::string::~string((string *)&local_1200);
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_1220);
        ::std::__cxx11::string::~string((string *)&local_1220);
        this_local._7_1_ = 0;
        base_prim_path._204_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_11a0);
        goto LAB_005627e7;
      }
      nonstd::optional_lite::optional<tinyusdz::Path>::optional
                ((optional<tinyusdz::Path> *)local_cf8);
      bVar2 = ReadBasicType(this,(optional<tinyusdz::Path> *)local_cf8);
      if (bVar2) {
        bVar2 = nonstd::optional_lite::optional<tinyusdz::Path>::has_value
                          ((optional<tinyusdz::Path> *)local_cf8);
        if (bVar2) {
          ::std::__cxx11::ostringstream::ostringstream(local_1008);
          poVar3 = ::std::operator<<((ostream *)local_1008,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ParseRelationship");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xdda);
          ::std::operator<<(poVar3," ");
          poVar3 = ::std::operator<<((ostream *)local_1008,"Failed to parse None.");
          ::std::operator<<(poVar3,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,&local_1028);
          ::std::__cxx11::string::~string((string *)&local_1028);
          this_local._7_1_ = 0;
          base_prim_path._204_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_1008);
        }
        else {
          Relationship::set_blocked(result);
          base_prim_path._204_4_ = 0;
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_e70);
        poVar3 = ::std::operator<<((ostream *)local_e70,"[error]");
        poVar3 = ::std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar3 = ::std::operator<<(poVar3,":");
        poVar3 = ::std::operator<<(poVar3,"ParseRelationship");
        poVar3 = ::std::operator<<(poVar3,"():");
        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xdd5);
        ::std::operator<<(poVar3," ");
        poVar3 = ::std::operator<<((ostream *)local_e70,"Failed to parse None.");
        ::std::operator<<(poVar3,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_e90);
        ::std::__cxx11::string::~string((string *)&local_e90);
        this_local._7_1_ = 0;
        base_prim_path._204_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_e70);
      }
      nonstd::optional_lite::optional<tinyusdz::Path>::~optional
                ((optional<tinyusdz::Path> *)local_cf8);
    }
    if (base_prim_path._204_4_ == 0) {
      bVar2 = SkipWhitespaceAndNewline(this,true);
      if (bVar2) {
        this_local._7_1_ = 1;
      }
      else {
        this_local._7_1_ = 0;
      }
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_005627e7:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::ParseRelationship(Relationship *result) {
  char c;
  if (!LookChar1(&c)) {
    return false;
  }

  if (c == '<') {
    // Path
    Path value;
    if (!ReadBasicType(&value)) {
      PUSH_ERROR_AND_RETURN("Failed to parse Path.");
    }

    // Resolve relative path here.
    // NOTE: Internally, USD(Crate) does not allow relative path.
    Path base_prim_path(GetCurrentPrimPath(), "");
    Path abs_path;
    std::string err;
    if (!pathutil::ResolveRelativePath(base_prim_path, value, &abs_path,
                                       &err)) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Invalid relative Path: {}. error = {}", value, err));
    }

    result->set(abs_path);
  } else if (c == '[') {
    // PathVector
    std::vector<Path> values;
    if (!ParseBasicTypeArray(&values)) {
      PUSH_ERROR_AND_RETURN("Failed to parse PathVector.");
    }

    // Resolve relative path here.
    // NOTE: Internally, USD(Crate) does not allow relative path.
    for (size_t i = 0; i < values.size(); i++) {
      Path base_prim_path(GetCurrentPrimPath(), "");
      Path abs_path;
      if (!pathutil::ResolveRelativePath(base_prim_path, values[i],
                                         &abs_path)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Invalid relative Path: {}.",
                                          values[i].full_path_name()));
      }

      // replace
      values[i] = abs_path;
    }

    result->set(values);
  } else if (c == 'N') {
    // None
    nonstd::optional<Path> value;
    if (!ReadBasicType(&value)) {
      PUSH_ERROR_AND_RETURN("Failed to parse None.");
    }

    // Should be empty for None.
    if (value.has_value()) {
      PUSH_ERROR_AND_RETURN("Failed to parse None.");
    }

    DCOUT("Relationship valueblock.");
    result->set_blocked();
  } else {
    PUSH_ERROR_AND_RETURN("Unexpected char \"" + std::to_string(c) +
                          "\" found. Expects Path or PathVector.");
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  return true;
}